

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

void __thiscall
FlowGraph::InsertEdgeFromFinallyToEarlyExit
          (FlowGraph *this,BasicBlock *finallyEndBlock,LabelInstr *exitLabel)

{
  BaseDictionary<Region_*,_BasicBlock_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  code *pcVar1;
  BranchInstr *pBVar2;
  BranchInstr *firstInstr;
  LabelInstr *pLVar3;
  bool bVar4;
  IRKind IVar5;
  Instr *this_01;
  undefined4 *puVar6;
  Region *pRVar7;
  BasicBlock *pBVar8;
  FlowGraph *this_02;
  FlowEdge *pFVar9;
  bool local_79;
  BasicBlock *local_70;
  Region *local_68;
  BranchInstr *local_60;
  BranchInstr *brToExit_1;
  BranchInstr *brToExit;
  LabelInstr *brLabel;
  LabelInstr *leaveLabel;
  BasicBlock *nextBB;
  LabelInstr *lastLabel;
  Instr *lastInstr;
  LabelInstr *exitLabel_local;
  BasicBlock *finallyEndBlock_local;
  FlowGraph *this_local;
  
  lastInstr = &exitLabel->super_Instr;
  exitLabel_local = (LabelInstr *)finallyEndBlock;
  finallyEndBlock_local = (BasicBlock *)this;
  lastLabel = (LabelInstr *)BasicBlock::GetLastInstr(finallyEndBlock);
  this_01 = BasicBlock::GetFirstInstr((BasicBlock *)exitLabel_local);
  nextBB = (BasicBlock *)IR::Instr::AsLabelInstr(this_01);
  if ((((lastLabel->super_Instr).m_opcode != LeaveNull) &&
      ((lastLabel->super_Instr).m_opcode != Leave)) &&
     ((lastLabel->super_Instr).m_opcode != BrOnException)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x2b5,
                       "(lastInstr->m_opcode == Js::OpCode::LeaveNull || lastInstr->m_opcode == Js::OpCode::Leave || lastInstr->m_opcode == Js::OpCode::BrOnException)"
                       ,
                       "lastInstr->m_opcode == Js::OpCode::LeaveNull || lastInstr->m_opcode == Js::OpCode::Leave || lastInstr->m_opcode == Js::OpCode::BrOnException"
                      );
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  leaveLabel = (LabelInstr *)BasicBlock::GetNext((BasicBlock *)exitLabel_local);
  brLabel = IR::LabelInstr::New(Label,this->func,false);
  IR::Instr::InsertBefore(&lastLabel->super_Instr,&brLabel->super_Instr);
  AddBlock(this,&brLabel->super_Instr,&lastLabel->super_Instr,(BasicBlock *)leaveLabel,
           (BasicBlock *)exitLabel_local);
  pLVar3 = brLabel;
  pRVar7 = IR::LabelInstr::GetRegion((LabelInstr *)nextBB);
  IR::LabelInstr::SetRegion(pLVar3,pRVar7);
  pLVar3 = exitLabel_local;
  pBVar8 = IR::LabelInstr::GetBasicBlock(brLabel);
  AddEdge(this,(BasicBlock *)pLVar3,pBVar8);
  this_02 = (FlowGraph *)IR::Instr::GetPrevRealInstrOrLabel(&lastLabel->super_Instr);
  this_local = this_02;
  IVar5 = IR::Instr::GetKind((Instr *)this_02);
  local_79 = true;
  if (IVar5 != InstrKindLabel) {
    local_79 = IR::Instr::IsProfiledLabelInstr((Instr *)this_02);
  }
  if (local_79 == false) {
    brToExit = (BranchInstr *)IR::LabelInstr::New(Label,this->func,false);
    IR::Instr::InsertBefore(&brLabel->super_Instr,(Instr *)brToExit);
    brToExit_1 = IR::BranchInstr::New(BrOnException,(LabelInstr *)lastInstr,this->func);
    brToExit_1->field_0x58 = brToExit_1->field_0x58 & 0xef | 0x10;
    IR::Instr::SetByteCodeOffset(&brToExit_1->super_Instr,&lastLabel->super_Instr);
    IR::Instr::InsertBefore(&brLabel->super_Instr,&brToExit_1->super_Instr);
    firstInstr = brToExit;
    pBVar2 = brToExit_1;
    pBVar8 = BasicBlock::GetNext((BasicBlock *)exitLabel_local);
    AddBlock(this,&firstInstr->super_Instr,&pBVar2->super_Instr,pBVar8,(BasicBlock *)exitLabel_local
            );
    pBVar2 = brToExit;
    pRVar7 = IR::LabelInstr::GetRegion((LabelInstr *)nextBB);
    IR::LabelInstr::SetRegion((LabelInstr *)pBVar2,pRVar7);
    pLVar3 = exitLabel_local;
    pBVar8 = IR::LabelInstr::GetBasicBlock((LabelInstr *)brToExit);
    AddEdge(this,(BasicBlock *)pLVar3,pBVar8);
  }
  else {
    local_60 = IR::BranchInstr::New(BrOnException,(LabelInstr *)lastInstr,this->func);
    IR::Instr::SetByteCodeOffset(&local_60->super_Instr,&lastLabel->super_Instr);
    local_60->field_0x58 = local_60->field_0x58 & 0xef | 0x10;
    IR::Instr::InsertBefore(&brLabel->super_Instr,&local_60->super_Instr);
    pLVar3 = exitLabel_local;
    pBVar8 = IR::LabelInstr::GetBasicBlock((LabelInstr *)lastInstr);
    AddEdge(this,(BasicBlock *)pLVar3,pBVar8);
  }
  pFVar9 = FindEdge(this,(BasicBlock *)exitLabel_local,(BasicBlock *)leaveLabel);
  if (pFVar9 != (FlowEdge *)0x0) {
    BasicBlock::RemoveSucc((BasicBlock *)exitLabel_local,(BasicBlock *)leaveLabel,this);
  }
  this_00 = this->regToFinallyEndMap;
  local_68 = IR::LabelInstr::GetRegion((LabelInstr *)nextBB);
  local_70 = IR::LabelInstr::GetBasicBlock(brLabel);
  JsUtil::
  BaseDictionary<Region_*,_BasicBlock_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Item(this_00,&local_68,&local_70);
  return;
}

Assistant:

void FlowGraph::InsertEdgeFromFinallyToEarlyExit(BasicBlock *finallyEndBlock, IR::LabelInstr *exitLabel)
{
    IR::Instr * lastInstr = finallyEndBlock->GetLastInstr();
    IR::LabelInstr * lastLabel = finallyEndBlock->GetFirstInstr()->AsLabelInstr();

    Assert(lastInstr->m_opcode == Js::OpCode::LeaveNull || lastInstr->m_opcode == Js::OpCode::Leave || lastInstr->m_opcode == Js::OpCode::BrOnException);
    // Add a new block, add BrOnException to earlyexit, assign region
    // Finally
    // ...
    // L1:
    // LeaveNull
    // to
    // Finally
    // ...
    // L1:
    // BrOnException earlyExitLabel
    // L1':
    // LeaveNull

    BasicBlock *nextBB = finallyEndBlock->GetNext();

    IR::LabelInstr *leaveLabel = IR::LabelInstr::New(Js::OpCode::Label, this->func);
    lastInstr->InsertBefore(leaveLabel);

    this->AddBlock(leaveLabel, lastInstr, nextBB, finallyEndBlock /*prevBlock*/);
    leaveLabel->SetRegion(lastLabel->GetRegion());

    this->AddEdge(finallyEndBlock, leaveLabel->GetBasicBlock());

    // If the Leave/LeaveNull at the end of finally was not preceeded by a Label, we have to create a new block with BrOnException to early exit
    if (!lastInstr->GetPrevRealInstrOrLabel()->IsLabelInstr())
    {
        IR::LabelInstr *brLabel = IR::LabelInstr::New(Js::OpCode::Label, this->func);
        leaveLabel->InsertBefore(brLabel);

        IR::BranchInstr *brToExit = IR::BranchInstr::New(Js::OpCode::BrOnException, exitLabel, this->func);
        brToExit->m_brFinallyToEarlyExit = true;
        brToExit->SetByteCodeOffset(lastInstr);
        leaveLabel->InsertBefore(brToExit);

        this->AddBlock(brLabel, brToExit, finallyEndBlock->GetNext(), finallyEndBlock /*prevBlock*/);
        brLabel->SetRegion(lastLabel->GetRegion());

        this->AddEdge(finallyEndBlock, brLabel->GetBasicBlock());
    }
    else
    {
        // If the Leave/LeaveNull at the end of finally was preceeded by a Label, we reuse the block inserting BrOnException to early exit in it
        IR::BranchInstr *brToExit = IR::BranchInstr::New(Js::OpCode::BrOnException, exitLabel, this->func);
        brToExit->SetByteCodeOffset(lastInstr);
        brToExit->m_brFinallyToEarlyExit = true;
        leaveLabel->InsertBefore(brToExit);
        this->AddEdge(finallyEndBlock, exitLabel->GetBasicBlock());
    }

    // In case of throw/non-terminating loop, there maybe no edge to the next block
    if (this->FindEdge(finallyEndBlock, nextBB))
    {
        finallyEndBlock->RemoveSucc(nextBB, this);
    }

    this->regToFinallyEndMap->Item(lastLabel->GetRegion(), leaveLabel->GetBasicBlock());
}